

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O0

void Cec_ManTransformPattern(Gia_Man_t *p,int iOut,int *pValues)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  int local_24;
  int i;
  int *pValues_local;
  int iOut_local;
  Gia_Man_t *p_local;
  
  if (p->pCexComb == (Abc_Cex_t *)0x0) {
    iVar1 = Gia_ManCiNum(p);
    pAVar2 = Abc_CexAlloc(0,iVar1,1);
    p->pCexComb = pAVar2;
    p->pCexComb->iPo = iOut;
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManCiNum(p);
      if (iVar1 <= local_24) break;
      if ((pValues != (int *)0x0) && (pValues[local_24] != 0)) {
        Abc_InfoSetBit((uint *)(p->pCexComb + 1),local_24);
      }
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("p->pCexComb == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCec.c"
                ,0x34,"void Cec_ManTransformPattern(Gia_Man_t *, int, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Saves the input pattern with the given number.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManTransformPattern( Gia_Man_t * p, int iOut, int * pValues )
{
    int i;
    assert( p->pCexComb == NULL );
    p->pCexComb = Abc_CexAlloc( 0, Gia_ManCiNum(p), 1 );
    p->pCexComb->iPo = iOut;
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        if ( pValues && pValues[i] )
            Abc_InfoSetBit( p->pCexComb->pData, i );
}